

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O0

int __thiscall dic::dictAdd(dic *this,int dictidx,void *key,void *obj)

{
  ulong uVar1;
  uint uVar2;
  reference pvVar3;
  void *pvVar4;
  dictEntry *newEntry;
  dictEntry *tmp;
  int index;
  int hash;
  void *obj_local;
  void *key_local;
  int dictidx_local;
  dic *this_local;
  
  pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  pvVar3->type->hashFunction = murmurhash2;
  pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  uVar2 = (*pvVar3->type->hashFunction)(key);
  pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
  this_local._4_4_ = uVar2 & (uint)pvVar3->ht[0].sizemask;
  pvVar4 = dict_find(this,dictidx,0,key);
  if (pvVar4 == (void *)0x0) {
    pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
    if (pvVar3->ht[0].table[(int)this_local._4_4_] == (dictEntry *)0x0) {
      pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      pvVar3->ht[0].table[(int)this_local._4_4_]->key = key;
      pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      (pvVar3->ht[0].table[(int)this_local._4_4_]->v).val = obj;
      pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      pvVar3->ht[0].table[(int)this_local._4_4_]->next = (dictEntry *)0x0;
    }
    else {
      pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
      for (newEntry = pvVar3->ht[0].table[(int)this_local._4_4_]; newEntry != (dictEntry *)0x0;
          newEntry = newEntry->next) {
      }
      uRam0000000000000010 = 0;
      pvRam0000000000000000 = key;
      pvRam0000000000000008 = obj;
    }
    pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
    pvVar3->ht[0].used = pvVar3->ht[0].used + 1;
    pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
    uVar1 = pvVar3->ht[0].used;
    pvVar3 = std::vector<dict,_std::allocator<dict>_>::operator[](&this->dc,(long)dictidx);
    if (uVar1 / pvVar3->ht[0].size != 0) {
      rehash(this,dictidx);
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int dic::dictAdd(int dictidx,void *key,void *obj){
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    int hash=dc[dictidx].type->hashFunction(key);
    int index=hash&dc[dictidx].ht[0].sizemask;
    if(dic::dict_find(dictidx,0,key)==NULL){
        if(dc[dictidx].ht[0].table[index]==NULL){
            dc[dictidx].ht[0].table[index]->key=key;
            dc[dictidx].ht[0].table[index]->v.val=obj;
            dc[dictidx].ht[0].table[index]->next=NULL;
        }else{
            dictEntry *tmp=dc[dictidx].ht[0].table[index];  
            while(tmp!=NULL)
                tmp=tmp->next;
            dictEntry *newEntry=NULL;
            newEntry->key=key;
            newEntry->v.val=obj;
            newEntry->next=NULL;
            tmp->next=newEntry;
        }
        dc[dictidx].ht[0].used++;
        if(dc[dictidx].ht[0].used/dc[dictidx].ht[0].size>=1)
            dic::rehash(dictidx);
        //if rehash

        return index;}  
    else return -1;//already in 
}